

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

int google::protobuf::compiler::ruby::GeneratePackageModules(FileDescriptor *file,Printer *printer)

{
  pointer pcVar1;
  size_type sVar2;
  void *pvVar3;
  long lVar4;
  char *pcVar5;
  undefined8 unaff_R12;
  ulong uVar6;
  int iVar7;
  string_view text;
  string_view str;
  string_view str_00;
  string_view name;
  string delimiter;
  string package_name;
  string component;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  long local_b0 [2];
  char *local_a0;
  char *local_98;
  char local_90;
  undefined7 uStack_8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  long local_40;
  ulong local_38;
  
  local_a0 = &local_90;
  local_98 = (char *)0x0;
  local_90 = '\0';
  if ((*(byte *)((long)&file->options_->field_0 + 0x19) & 2) == 0) {
    pcVar1 = (file->package_->_M_dataplus)._M_p;
    local_c0._M_len = (size_t)local_b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,pcVar1,pcVar1 + file->package_->_M_string_length);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_c0);
    if ((long *)local_c0._M_len != local_b0) {
      operator_delete((void *)local_c0._M_len,local_b0[0] + 1);
    }
    uVar6 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_a0);
    local_c0._M_len = (size_t)local_98;
    local_c0._M_str = local_a0;
    uVar6 = 0;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_c0,"::",0,2);
    pcVar5 = local_a0;
    if (((sVar2 == 0xffffffffffffffff) && (uVar6 = 1, local_98 != (char *)0x0)) &&
       (pvVar3 = memchr(local_a0,0x2e,(size_t)local_98),
       (long)pvVar3 - (long)pcVar5 != -1 && pvVar3 != (void *)0x0)) {
      absl::lts_20250127::log_internal::LogMessage::LogMessage
                ((LogMessage *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                 ,0xac);
      str._M_str = "ruby_package option should be in the form of:";
      str._M_len = 0x2d;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_c0,str);
      str_00._M_str = " \'A::B::C\' and not \'A.B.C\'";
      str_00._M_len = 0x1a;
      absl::lts_20250127::log_internal::LogMessage::
      CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                ((LogMessage *)&local_c0,str_00);
      absl::lts_20250127::log_internal::LogMessage::~LogMessage((LogMessage *)&local_c0);
    }
  }
  pcVar5 = "::";
  if ((char)uVar6 != '\0') {
    pcVar5 = ".";
  }
  local_c0._M_len = (size_t)local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c0,pcVar5,pcVar5 + (2 - (uVar6 & 0xff)));
  if (local_98 == (char *)0x0) {
    iVar7 = 0;
  }
  else {
    local_40 = 2 - (uVar6 & 0xff);
    iVar7 = 0;
    local_38 = uVar6;
    do {
      lVar4 = std::__cxx11::string::find((char *)&local_a0,local_c0._M_len,0);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      local_80._M_string_length = 0;
      local_80.field_2._M_local_buf[0] = '\0';
      if (lVar4 == -1) {
        std::__cxx11::string::_M_assign((string *)&local_80);
        pcVar5 = anon_var_dwarf_a12c75 + 5;
        std::__cxx11::string::_M_replace((ulong)&local_a0,0,local_98,0x1141ae9);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_a0);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pcVar5 = (char *)0xffffffffffffffff;
        std::__cxx11::string::substr((ulong)&local_60,(ulong)&local_a0);
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      if ((char)local_38 != '\0') {
        name._M_str = pcVar5;
        name._M_len = (size_t)local_80._M_dataplus._M_p;
        PackageToModule_abi_cxx11_(&local_60,(ruby *)local_80._M_string_length,name);
        std::__cxx11::string::operator=((string *)&local_80,(string *)&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      text._M_str = "module $name$\n";
      text._M_len = 0xe;
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,text,(char (*) [5])0x10f3c63,&local_80);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      iVar7 = iVar7 + 1;
    } while (local_98 != (char *)0x0);
  }
  if ((long *)local_c0._M_len != local_b0) {
    operator_delete((void *)local_c0._M_len,local_b0[0] + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  return iVar7;
}

Assistant:

int GeneratePackageModules(const FileDescriptor* file, io::Printer* printer) {
  int levels = 0;
  bool need_change_to_module = true;
  std::string package_name;

  // Determine the name to use in either format:
  //   proto package:         one.two.three
  //   option ruby_package:   One::Two::Three
  if (file->options().has_ruby_package()) {
    package_name = file->options().ruby_package();

    // If :: is in the package use the Ruby formatted name as-is
    //    -> A::B::C
    // otherwise, use the dot separator
    //    -> A.B.C
    if (absl::StrContains(package_name, "::")) {
      need_change_to_module = false;
    } else if (absl::StrContains(package_name, '.')) {
      ABSL_LOG(WARNING) << "ruby_package option should be in the form of:"
                        << " 'A::B::C' and not 'A.B.C'";
    }
  } else {
    package_name = std::string(file->package());
  }

  // Use the appropriate delimiter
  std::string delimiter = need_change_to_module ? "." : "::";
  size_t delimiter_size = need_change_to_module ? 1 : 2;

  // Extract each module name and indent
  while (!package_name.empty()) {
    size_t dot_index = package_name.find(delimiter);
    std::string component;
    if (dot_index == std::string::npos) {
      component = package_name;
      package_name = "";
    } else {
      component = package_name.substr(0, dot_index);
      package_name = package_name.substr(dot_index + delimiter_size);
    }
    if (need_change_to_module) {
      component = PackageToModule(component);
    }
    printer->Print("module $name$\n", "name", component);
    printer->Indent();
    levels++;
  }
  return levels;
}